

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O3

void sendOneToEachWriterRank(SstStream Stream,CMFormat f,void *Msg,void **WS_StreamPtr)

{
  CMConnection p_Var1;
  int iVar2;
  int peer;
  uint uVar3;
  long lVar4;
  
  if (Stream->WriterConfigParams->CPCommPattern == 1) {
    uVar3 = *Stream->Peers;
    if (uVar3 != 0xffffffff) {
      lVar4 = 4;
      do {
        p_Var1 = Stream->ConnectionsToWriter[(int)uVar3].CMconn;
        *WS_StreamPtr = Stream->ConnectionsToWriter[(int)uVar3].RemoteStreamID;
        iVar2 = CMwrite(p_Var1,f,Msg);
        if ((iVar2 != 1) && (Stream->Status < PeerClosed)) {
          CP_verbose(Stream,CriticalVerbose,"Message failed to send to writer %d (%p)\n",
                     (ulong)uVar3,*WS_StreamPtr);
        }
        uVar3 = *(uint *)((long)Stream->Peers + lVar4);
        lVar4 = lVar4 + 4;
      } while (uVar3 != 0xffffffff);
    }
  }
  else if (Stream->Rank == 0) {
    p_Var1 = Stream->ConnectionsToWriter->CMconn;
    *WS_StreamPtr = Stream->ConnectionsToWriter->RemoteStreamID;
    iVar2 = CMwrite(p_Var1,f,Msg);
    if ((iVar2 != 1) && (Stream->Status < PeerClosed)) {
      CP_verbose(Stream,CriticalVerbose,"Message failed to send to writer %d (%p)\n",0,*WS_StreamPtr
                );
      return;
    }
  }
  return;
}

Assistant:

static void sendOneToEachWriterRank(SstStream Stream, CMFormat f, void *Msg, void **WS_StreamPtr)
{
    if (Stream->WriterConfigParams->CPCommPattern == SstCPCommPeer)
    {
        int i = 0;
        while (Stream->Peers[i] != -1)
        {
            int peer = Stream->Peers[i];
            CMConnection conn = Stream->ConnectionsToWriter[peer].CMconn;
            /* add the writer Stream identifier to each outgoing
             * message */
            *WS_StreamPtr = Stream->ConnectionsToWriter[peer].RemoteStreamID;
            if (CMwrite(conn, f, Msg) != 1)
            {
                switch (Stream->Status)
                {
                case NotOpen:
                case Opening:
                case Established:
                    CP_verbose(Stream, CriticalVerbose,
                               "Message failed to send to writer %d (%p)\n", peer,
                               (void *)*WS_StreamPtr);
                    break;
                case PeerClosed:
                case PeerFailed:
                case Closed:
                case Destroyed:
                    // Don't warn on send failures for closing/closed clients
                    break;
                }
            }
            i++;
        }
    }
    else
    {
        if (Stream->Rank == 0)
        {
            int peer = 0;
            CMConnection conn = Stream->ConnectionsToWriter[peer].CMconn;
            /* add the writer Stream identifier to each outgoing
             * message */
            *WS_StreamPtr = Stream->ConnectionsToWriter[peer].RemoteStreamID;
            if (CMwrite(conn, f, Msg) != 1)
            {
                switch (Stream->Status)
                {
                case NotOpen:
                case Opening:
                case Established:
                    CP_verbose(Stream, CriticalVerbose,
                               "Message failed to send to writer %d (%p)\n", peer,
                               (void *)*WS_StreamPtr);
                    break;
                case PeerClosed:
                case PeerFailed:
                case Closed:
                case Destroyed:
                    // Don't warn on send failures for closing/closed clients
                    break;
                }
            }
        }
    }
}